

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grad-check.cc
# Opt level: O3

bool cnn::CheckGrad(Model *m,ComputationGraph *g,int verbosity)

{
  undefined8 *puVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  byte bVar6;
  byte bVar7;
  ComputationGraph *pCVar8;
  uint uVar9;
  ostream *poVar10;
  Tensor *pTVar11;
  Tensor *pTVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  undefined8 *puVar16;
  char *pcVar17;
  byte bVar18;
  int iVar19;
  Tensor *pTVar20;
  long *plVar21;
  long *plVar22;
  ushort uVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  float fVar32;
  real rVar33;
  undefined1 auVar34 [16];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  double dVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar38;
  char local_9a [2];
  ulong local_98;
  Tensor *local_90;
  double local_88;
  int local_7c;
  undefined1 local_78 [16];
  Model *local_68;
  long *local_60;
  undefined1 local_58 [16];
  long *local_48;
  long *local_40;
  ComputationGraph *local_38;
  
  puVar1 = *(undefined8 **)(m + 0x20);
  local_7c = verbosity;
  local_68 = m;
  local_38 = g;
  for (puVar16 = *(undefined8 **)(m + 0x18); puVar16 != puVar1; puVar16 = puVar16 + 1) {
    Parameters::clear((Parameters *)*puVar16);
  }
  puVar1 = *(undefined8 **)(local_68 + 0x38);
  for (puVar16 = *(undefined8 **)(local_68 + 0x30); pCVar8 = local_38, puVar16 != puVar1;
      puVar16 = puVar16 + 1) {
    LookupParameters::clear((LookupParameters *)*puVar16);
  }
  ComputationGraph::forward(local_38);
  ComputationGraph::backward(pCVar8);
  iVar15 = local_7c;
  plVar21 = *(long **)(local_68 + 0x18);
  local_48 = *(long **)(local_68 + 0x20);
  if (plVar21 == local_48) {
    bVar18 = 0;
    local_98 = 0;
  }
  else {
    auVar25 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar26 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    bVar18 = 0;
    local_98 = 0;
    do {
      lVar14 = *plVar21;
      local_60 = plVar21;
      if (1 < iVar15) {
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
        std::ostream::put(-0x80);
        poVar10 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"PARAMETERS ",0xb);
        poVar10 = std::ostream::_M_insert<void_const*>(poVar10);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
        auVar26 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar25 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      }
      if ((ulong)*(uint *)(lVar14 + 0x24) == 0) {
        iVar19 = 1;
      }
      else {
        auVar27 = vpbroadcastd_avx512f(ZEXT416(1));
        auVar28 = vpbroadcastq_avx512f();
        uVar13 = 0;
        do {
          auVar29 = vpbroadcastq_avx512f();
          auVar30 = vmovdqa64_avx512f(auVar27);
          auVar27 = vporq_avx512f(auVar29,auVar25);
          auVar29 = vporq_avx512f(auVar29,auVar26);
          uVar5 = vpcmpuq_avx512f(auVar29,auVar28,2);
          bVar6 = (byte)uVar5;
          uVar5 = vpcmpuq_avx512f(auVar27,auVar28,2);
          bVar7 = (byte)uVar5;
          uVar23 = CONCAT11(bVar7,bVar6);
          auVar27 = vmovdqu32_avx512f(*(undefined1 (*) [64])(lVar14 + 8 + uVar13 * 4));
          auVar29._4_4_ = (uint)((byte)(uVar23 >> 1) & 1) * auVar27._4_4_;
          auVar29._0_4_ = (uint)(bVar6 & 1) * auVar27._0_4_;
          auVar29._8_4_ = (uint)((byte)(uVar23 >> 2) & 1) * auVar27._8_4_;
          auVar29._12_4_ = (uint)((byte)(uVar23 >> 3) & 1) * auVar27._12_4_;
          auVar29._16_4_ = (uint)((byte)(uVar23 >> 4) & 1) * auVar27._16_4_;
          auVar29._20_4_ = (uint)((byte)(uVar23 >> 5) & 1) * auVar27._20_4_;
          auVar29._24_4_ = (uint)((byte)(uVar23 >> 6) & 1) * auVar27._24_4_;
          auVar29._28_4_ = (uint)((byte)(uVar23 >> 7) & 1) * auVar27._28_4_;
          auVar29._32_4_ = (uint)(bVar7 & 1) * auVar27._32_4_;
          auVar29._36_4_ = (uint)(bVar7 >> 1 & 1) * auVar27._36_4_;
          auVar29._40_4_ = (uint)(bVar7 >> 2 & 1) * auVar27._40_4_;
          auVar29._44_4_ = (uint)(bVar7 >> 3 & 1) * auVar27._44_4_;
          auVar29._48_4_ = (uint)(bVar7 >> 4 & 1) * auVar27._48_4_;
          auVar29._52_4_ = (uint)(bVar7 >> 5 & 1) * auVar27._52_4_;
          auVar29._56_4_ = (uint)(bVar7 >> 6 & 1) * auVar27._56_4_;
          auVar29._60_4_ = (uint)(bVar7 >> 7) * auVar27._60_4_;
          uVar13 = uVar13 + 0x10;
          auVar27 = vpmulld_avx512f(auVar29,auVar30);
        } while (((ulong)*(uint *)(lVar14 + 0x24) + 0xf & 0x1fffffff0) != uVar13);
        auVar25 = vmovdqa32_avx512f(auVar27);
        auVar26._0_4_ = (uint)(bVar6 & 1) * auVar25._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar30._0_4_
        ;
        bVar2 = (bool)((byte)(uVar23 >> 1) & 1);
        auVar26._4_4_ = (uint)bVar2 * auVar25._4_4_ | (uint)!bVar2 * auVar30._4_4_;
        bVar2 = (bool)((byte)(uVar23 >> 2) & 1);
        auVar26._8_4_ = (uint)bVar2 * auVar25._8_4_ | (uint)!bVar2 * auVar30._8_4_;
        bVar2 = (bool)((byte)(uVar23 >> 3) & 1);
        auVar26._12_4_ = (uint)bVar2 * auVar25._12_4_ | (uint)!bVar2 * auVar30._12_4_;
        bVar2 = (bool)((byte)(uVar23 >> 4) & 1);
        auVar26._16_4_ = (uint)bVar2 * auVar25._16_4_ | (uint)!bVar2 * auVar30._16_4_;
        bVar2 = (bool)((byte)(uVar23 >> 5) & 1);
        auVar26._20_4_ = (uint)bVar2 * auVar25._20_4_ | (uint)!bVar2 * auVar30._20_4_;
        bVar2 = (bool)((byte)(uVar23 >> 6) & 1);
        auVar26._24_4_ = (uint)bVar2 * auVar25._24_4_ | (uint)!bVar2 * auVar30._24_4_;
        bVar2 = (bool)((byte)(uVar23 >> 7) & 1);
        auVar26._28_4_ = (uint)bVar2 * auVar25._28_4_ | (uint)!bVar2 * auVar30._28_4_;
        auVar26._32_4_ =
             (uint)(bVar7 & 1) * auVar25._32_4_ | (uint)!(bool)(bVar7 & 1) * auVar30._32_4_;
        bVar2 = (bool)(bVar7 >> 1 & 1);
        auVar26._36_4_ = (uint)bVar2 * auVar25._36_4_ | (uint)!bVar2 * auVar30._36_4_;
        bVar2 = (bool)(bVar7 >> 2 & 1);
        auVar26._40_4_ = (uint)bVar2 * auVar25._40_4_ | (uint)!bVar2 * auVar30._40_4_;
        bVar2 = (bool)(bVar7 >> 3 & 1);
        auVar26._44_4_ = (uint)bVar2 * auVar25._44_4_ | (uint)!bVar2 * auVar30._44_4_;
        bVar2 = (bool)(bVar7 >> 4 & 1);
        auVar26._48_4_ = (uint)bVar2 * auVar25._48_4_ | (uint)!bVar2 * auVar30._48_4_;
        bVar2 = (bool)(bVar7 >> 5 & 1);
        auVar26._52_4_ = (uint)bVar2 * auVar25._52_4_ | (uint)!bVar2 * auVar30._52_4_;
        bVar2 = (bool)(bVar7 >> 6 & 1);
        auVar26._56_4_ = (uint)bVar2 * auVar25._56_4_ | (uint)!bVar2 * auVar30._56_4_;
        auVar26._60_4_ =
             (uint)(bVar7 >> 7) * auVar25._60_4_ | (uint)!(bool)(bVar7 >> 7) * auVar30._60_4_;
        auVar24 = vextracti64x4_avx512f(auVar26,1);
        auVar25 = vpmulld_avx512f(auVar26,ZEXT3264(auVar24));
        auVar3 = vpmulld_avx(auVar25._0_16_,auVar25._16_16_);
        auVar4 = vpshufd_avx(auVar3,0xee);
        auVar3 = vpmulld_avx(auVar3,auVar4);
        auVar4 = vpshufd_avx(auVar3,0x55);
        auVar3 = vpmulld_avx(auVar3,auVar4);
        iVar19 = auVar3._0_4_;
      }
      uVar9 = iVar19 * *(int *)(lVar14 + 0x28);
      if (uVar9 != 0) {
        pTVar20 = (Tensor *)(lVar14 + 0x30);
        local_90 = (Tensor *)(lVar14 + 0x78);
        plVar21 = (long *)0x0;
        local_40 = (long *)(ulong)uVar9;
        do {
          iVar19 = (int)plVar21;
          fVar32 = TensorTools::AccessElement(pTVar20,iVar19);
          local_78._0_4_ = fVar32;
          TensorTools::SetElement(pTVar20,iVar19,fVar32 + -0.0005);
          pCVar8 = local_38;
          pTVar11 = ComputationGraph::forward(local_38);
          rVar33 = as_scalar(pTVar11);
          local_58._0_4_ = rVar33;
          TensorTools::SetElement(pTVar20,iVar19,(float)local_78._0_4_ + 0.0005);
          pTVar11 = ComputationGraph::forward(pCVar8);
          rVar33 = as_scalar(pTVar11);
          local_88 = (double)CONCAT44(local_88._4_4_,rVar33);
          TensorTools::SetElement(pTVar20,iVar19,(float)local_78._0_4_);
          local_78 = ZEXT416((uint)((local_88._0_4_ - (float)local_58._0_4_) * 999.99994));
          auVar25._0_4_ = TensorTools::AccessElement(local_90,iVar19);
          auVar25._4_60_ = extraout_var;
          auVar36._8_4_ = 0x7fffffff;
          auVar36._0_8_ = 0x7fffffff7fffffff;
          auVar36._12_4_ = 0x7fffffff;
          auVar3 = vandps_avx(local_78,auVar36);
          auVar4 = vandps_avx(ZEXT416((uint)(local_78._0_4_ - auVar25._0_4_)),auVar36);
          fVar38 = auVar4._0_4_;
          auVar34 = auVar25._0_16_;
          auVar4 = vandps_avx(auVar34,auVar36);
          auVar3 = vmaxss_avx(auVar4,auVar3);
          fVar32 = auVar3._0_4_;
          dVar35 = (double)(fVar38 / (float)((uint)(0.1 < fVar38) *
                                             ((uint)(0.0 < fVar32) * (int)fVar32 +
                                             (uint)(0.0 >= fVar32) * 0x3f800000) +
                                            (uint)(0.1 >= fVar38) * 0x3f800000));
          if (0.1 < dVar35 && 0 < iVar15) {
            local_88 = dVar35;
            local_58 = auVar34;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"***[",4);
            poVar10 = std::ostream::_M_insert<double>(local_88);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,"] ",2);
            bVar18 = 1;
            local_98 = CONCAT71((int7)((ulong)poVar10 >> 8),1);
            auVar34 = local_58;
          }
          else {
            local_98 = CONCAT71((int7)(local_98 >> 8),(byte)local_98 | 0.1 < dVar35);
          }
          if (1 < (int)((uint)bVar18 + iVar15)) {
            poVar10 = std::ostream::_M_insert<double>((double)auVar34._0_4_);
            local_9a[0] = ' ';
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_9a,1);
            poVar10 = std::ostream::_M_insert<double>((double)(float)local_78._0_4_);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
            std::ostream::put((char)poVar10);
            std::ostream::flush();
            bVar18 = 0;
          }
          plVar21 = (long *)((long)plVar21 + 1);
        } while (local_40 != plVar21);
      }
      auVar25 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar26 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      plVar21 = local_60 + 1;
    } while (plVar21 != local_48);
  }
  plVar21 = *(long **)(local_68 + 0x30);
  local_68 = *(Model **)(local_68 + 0x38);
  if ((Model *)plVar21 != local_68) {
    auVar25 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar26 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      plVar22 = (long *)*plVar21;
      local_60 = plVar22;
      local_48 = plVar21;
      if (1 < iVar15) {
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
        std::ostream::put(-0x80);
        poVar10 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"LOOKUP PARAMETERS ",0x12);
        poVar10 = std::ostream::_M_insert<void_const*>(poVar10);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        plVar22 = local_60;
        std::ostream::put((char)poVar10);
        std::ostream::flush();
        auVar26 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar25 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      }
      if ((ulong)*(uint *)((long)plVar22 + 0x24) == 0) {
        local_90 = (Tensor *)0x1;
      }
      else {
        auVar27 = vpbroadcastd_avx512f(ZEXT416(1));
        auVar28 = vpbroadcastq_avx512f();
        uVar13 = 0;
        do {
          auVar29 = vpbroadcastq_avx512f();
          auVar30 = vmovdqa64_avx512f(auVar27);
          auVar27 = vporq_avx512f(auVar29,auVar25);
          auVar29 = vporq_avx512f(auVar29,auVar26);
          uVar5 = vpcmpuq_avx512f(auVar29,auVar28,2);
          bVar6 = (byte)uVar5;
          uVar5 = vpcmpuq_avx512f(auVar27,auVar28,2);
          bVar7 = (byte)uVar5;
          uVar23 = CONCAT11(bVar7,bVar6);
          auVar27 = vmovdqu32_avx512f(*(undefined1 (*) [64])((long)(plVar22 + 1) + uVar13 * 4));
          auVar31._4_4_ = (uint)((byte)(uVar23 >> 1) & 1) * auVar27._4_4_;
          auVar31._0_4_ = (uint)(bVar6 & 1) * auVar27._0_4_;
          auVar31._8_4_ = (uint)((byte)(uVar23 >> 2) & 1) * auVar27._8_4_;
          auVar31._12_4_ = (uint)((byte)(uVar23 >> 3) & 1) * auVar27._12_4_;
          auVar31._16_4_ = (uint)((byte)(uVar23 >> 4) & 1) * auVar27._16_4_;
          auVar31._20_4_ = (uint)((byte)(uVar23 >> 5) & 1) * auVar27._20_4_;
          auVar31._24_4_ = (uint)((byte)(uVar23 >> 6) & 1) * auVar27._24_4_;
          auVar31._28_4_ = (uint)((byte)(uVar23 >> 7) & 1) * auVar27._28_4_;
          auVar31._32_4_ = (uint)(bVar7 & 1) * auVar27._32_4_;
          auVar31._36_4_ = (uint)(bVar7 >> 1 & 1) * auVar27._36_4_;
          auVar31._40_4_ = (uint)(bVar7 >> 2 & 1) * auVar27._40_4_;
          auVar31._44_4_ = (uint)(bVar7 >> 3 & 1) * auVar27._44_4_;
          auVar31._48_4_ = (uint)(bVar7 >> 4 & 1) * auVar27._48_4_;
          auVar31._52_4_ = (uint)(bVar7 >> 5 & 1) * auVar27._52_4_;
          auVar31._56_4_ = (uint)(bVar7 >> 6 & 1) * auVar27._56_4_;
          auVar31._60_4_ = (uint)(bVar7 >> 7) * auVar27._60_4_;
          uVar13 = uVar13 + 0x10;
          auVar27 = vpmulld_avx512f(auVar31,auVar30);
        } while (((ulong)*(uint *)((long)plVar22 + 0x24) + 0xf & 0x1fffffff0) != uVar13);
        auVar25 = vmovdqa32_avx512f(auVar27);
        auVar27._0_4_ = (uint)(bVar6 & 1) * auVar25._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar30._0_4_
        ;
        bVar2 = (bool)((byte)(uVar23 >> 1) & 1);
        auVar27._4_4_ = (uint)bVar2 * auVar25._4_4_ | (uint)!bVar2 * auVar30._4_4_;
        bVar2 = (bool)((byte)(uVar23 >> 2) & 1);
        auVar27._8_4_ = (uint)bVar2 * auVar25._8_4_ | (uint)!bVar2 * auVar30._8_4_;
        bVar2 = (bool)((byte)(uVar23 >> 3) & 1);
        auVar27._12_4_ = (uint)bVar2 * auVar25._12_4_ | (uint)!bVar2 * auVar30._12_4_;
        bVar2 = (bool)((byte)(uVar23 >> 4) & 1);
        auVar27._16_4_ = (uint)bVar2 * auVar25._16_4_ | (uint)!bVar2 * auVar30._16_4_;
        bVar2 = (bool)((byte)(uVar23 >> 5) & 1);
        auVar27._20_4_ = (uint)bVar2 * auVar25._20_4_ | (uint)!bVar2 * auVar30._20_4_;
        bVar2 = (bool)((byte)(uVar23 >> 6) & 1);
        auVar27._24_4_ = (uint)bVar2 * auVar25._24_4_ | (uint)!bVar2 * auVar30._24_4_;
        bVar2 = (bool)((byte)(uVar23 >> 7) & 1);
        auVar27._28_4_ = (uint)bVar2 * auVar25._28_4_ | (uint)!bVar2 * auVar30._28_4_;
        auVar27._32_4_ =
             (uint)(bVar7 & 1) * auVar25._32_4_ | (uint)!(bool)(bVar7 & 1) * auVar30._32_4_;
        bVar2 = (bool)(bVar7 >> 1 & 1);
        auVar27._36_4_ = (uint)bVar2 * auVar25._36_4_ | (uint)!bVar2 * auVar30._36_4_;
        bVar2 = (bool)(bVar7 >> 2 & 1);
        auVar27._40_4_ = (uint)bVar2 * auVar25._40_4_ | (uint)!bVar2 * auVar30._40_4_;
        bVar2 = (bool)(bVar7 >> 3 & 1);
        auVar27._44_4_ = (uint)bVar2 * auVar25._44_4_ | (uint)!bVar2 * auVar30._44_4_;
        bVar2 = (bool)(bVar7 >> 4 & 1);
        auVar27._48_4_ = (uint)bVar2 * auVar25._48_4_ | (uint)!bVar2 * auVar30._48_4_;
        bVar2 = (bool)(bVar7 >> 5 & 1);
        auVar27._52_4_ = (uint)bVar2 * auVar25._52_4_ | (uint)!bVar2 * auVar30._52_4_;
        bVar2 = (bool)(bVar7 >> 6 & 1);
        auVar27._56_4_ = (uint)bVar2 * auVar25._56_4_ | (uint)!bVar2 * auVar30._56_4_;
        auVar27._60_4_ =
             (uint)(bVar7 >> 7) * auVar25._60_4_ | (uint)!(bool)(bVar7 >> 7) * auVar30._60_4_;
        auVar24 = vextracti64x4_avx512f(auVar27,1);
        auVar25 = vpmulld_avx512f(auVar27,ZEXT3264(auVar24));
        auVar3 = vpmulld_avx(auVar25._0_16_,auVar25._16_16_);
        auVar4 = vpshufd_avx(auVar3,0xee);
        auVar3 = vpmulld_avx(auVar3,auVar4);
        auVar4 = vpshufd_avx(auVar3,0x55);
        auVar3 = vpmulld_avx(auVar3,auVar4);
        local_90 = (Tensor *)CONCAT44((int)((ulong)(plVar22 + 1) >> 0x20),auVar3._0_4_);
      }
      plVar21 = (long *)plVar22[0xe];
      if (plVar21 != (long *)0x0) {
        local_90 = (Tensor *)(ulong)(uint)((int)local_90 * (int)plVar22[5]);
        do {
          uVar9 = *(uint *)(plVar21 + 1);
          local_40 = plVar21;
          if (1 < iVar15) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"OBJECT=",7);
            poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
            std::ostream::put((char)poVar10);
            std::ostream::flush();
          }
          if ((int)local_90 != 0) {
            pTVar20 = (Tensor *)0x0;
            pTVar11 = (Tensor *)(local_60[6] + (ulong)uVar9 * 0x48);
            lVar14 = local_60[9];
            do {
              iVar19 = (int)pTVar20;
              fVar32 = TensorTools::AccessElement(pTVar11,iVar19);
              local_78._0_4_ = fVar32;
              TensorTools::SetElement(pTVar11,iVar19,fVar32 + -0.0005);
              pCVar8 = local_38;
              pTVar12 = ComputationGraph::forward(local_38);
              rVar33 = as_scalar(pTVar12);
              local_58._0_4_ = rVar33;
              TensorTools::SetElement(pTVar11,iVar19,(float)local_78._0_4_ + 0.0005);
              pTVar12 = ComputationGraph::forward(pCVar8);
              rVar33 = as_scalar(pTVar12);
              local_88 = (double)CONCAT44(local_88._4_4_,rVar33);
              TensorTools::SetElement(pTVar11,iVar19,(float)local_78._0_4_);
              local_78 = ZEXT416((uint)((local_88._0_4_ - (float)local_58._0_4_) * 999.99994));
              auVar28._0_4_ =
                   TensorTools::AccessElement((Tensor *)((ulong)uVar9 * 0x48 + lVar14),iVar19);
              auVar28._4_60_ = extraout_var_00;
              auVar37._8_4_ = 0x7fffffff;
              auVar37._0_8_ = 0x7fffffff7fffffff;
              auVar37._12_4_ = 0x7fffffff;
              auVar3 = vandps_avx(local_78,auVar37);
              auVar4 = vandps_avx(ZEXT416((uint)(local_78._0_4_ - auVar28._0_4_)),auVar37);
              fVar38 = auVar4._0_4_;
              auVar34 = auVar28._0_16_;
              auVar4 = vandps_avx(auVar34,auVar37);
              auVar3 = vmaxss_avx(auVar4,auVar3);
              fVar32 = auVar3._0_4_;
              dVar35 = (double)(fVar38 / (float)((uint)(0.1 < fVar38) *
                                                 ((uint)(0.0 < fVar32) * (int)fVar32 +
                                                 (uint)(0.0 >= fVar32) * 0x3f800000) +
                                                (uint)(0.1 >= fVar38) * 0x3f800000));
              if (0.1 < dVar35 && 0 < iVar15) {
                local_88 = dVar35;
                local_58 = auVar34;
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"***[",4);
                poVar10 = std::ostream::_M_insert<double>(local_88);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,"] ",2);
                bVar18 = 1;
                local_98 = CONCAT71((int7)((ulong)poVar10 >> 8),1);
                auVar34 = local_58;
              }
              else {
                local_98 = CONCAT71((int7)(local_98 >> 8),(byte)local_98 | 0.1 < dVar35);
              }
              iVar15 = local_7c;
              if (1 < (int)((uint)bVar18 + local_7c)) {
                poVar10 = std::ostream::_M_insert<double>((double)auVar34._0_4_);
                local_9a[1] = 0x20;
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_9a + 1,1);
                poVar10 = std::ostream::_M_insert<double>((double)(float)local_78._0_4_);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
                std::ostream::put((char)poVar10);
                std::ostream::flush();
                bVar18 = 0;
              }
              pTVar20 = (Tensor *)((long)(pTVar20->d).d + 1);
            } while (local_90 != pTVar20);
          }
          plVar21 = (long *)*local_40;
        } while (plVar21 != (long *)0x0);
      }
      auVar25 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar26 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      plVar21 = local_48 + 1;
    } while ((Model *)plVar21 != local_68);
  }
  if ((local_98 & 1) == 0) {
    if (iVar15 < 1) goto LAB_00189467;
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
    std::ostream::put(-0x80);
    poVar10 = (ostream *)std::ostream::flush();
    pcVar17 = "GRADIENT CHECK PASSED";
    lVar14 = 0x15;
  }
  else {
    if (iVar15 < 2) goto LAB_00189467;
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
    std::ostream::put(-0x80);
    poVar10 = (ostream *)std::ostream::flush();
    pcVar17 = "*** GRADIENT CHECK FAILED ***";
    lVar14 = 0x1d;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar17,lVar14);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
LAB_00189467:
  return (bool)(~(byte)local_98 & 1);
}

Assistant:

bool CheckGrad(Model& m, ComputationGraph& g, int verbosity) {
  // Clear the parameters first
  const vector<Parameters*>& params = m.parameters_list();
  const vector<LookupParameters*>& lookup_params = m.lookup_parameters_list();
  for (auto pp : params)
    pp->clear();
  for (auto pp : lookup_params)
    pp->clear();

  // Perform forward and backward steps
  float alpha = 5e-4;
  g.forward();
  g.backward();

  // Check
  bool flag = false, curr_flag = false;
  for (auto pp : params) {
    if(verbosity > 1)
      cerr << endl << "PARAMETERS " << pp << endl;
    Parameters& p = *pp;
    size_t ts = p.dim.size();
    for (size_t i = 0; i < ts; ++i) {
      float old = TensorTools::AccessElement(p.values, i);
      TensorTools::SetElement(p.values, i, old - alpha);
      float E_left = as_scalar(g.forward());
      TensorTools::SetElement(p.values, i, old + alpha);
      float E_right = as_scalar(g.forward());
      TensorTools::SetElement(p.values, i, old);
      float g = (E_right - E_left) / (2 * alpha);
      float g_act = TensorTools::AccessElement(p.g, i);
      float f = fabs(g - g_act);
      float m = max(fabs(g), fabs(g_act));
      if (f > 0.1 && m > 0.f) f /= m;
      if (f > 0.1 || std::isnan(f)) { flag = true; if(verbosity > 0) { curr_flag = true; cerr << "***[" << f << "] "; } }
      if(verbosity + (curr_flag ? 1 : 0) > 1) {
        cerr << g_act << ' ' << g << endl;
        curr_flag = false;
      }
    }
  }

  for (auto pp : lookup_params) {
    if(verbosity > 1)
      cerr << endl << "LOOKUP PARAMETERS " << pp << endl;
    LookupParameters& p = *pp;
    size_t ts = p.dim.size();
    for (unsigned j : p.non_zero_grads) {
      if(verbosity > 1)
        cerr << "OBJECT=" << j << endl;
      Tensor& v = p.values[j];
      Tensor& ag = p.grads[j];
      for (size_t i = 0; i < ts; ++i) {
        float old = TensorTools::AccessElement(v, i);
        TensorTools::SetElement(v, i, old - alpha);
        float E_left = as_scalar(g.forward());
        TensorTools::SetElement(v, i, old + alpha);
        float E_right = as_scalar(g.forward());
        TensorTools::SetElement(v, i, old);
        float g = (E_right - E_left) / (2 * alpha);
        float g_act = TensorTools::AccessElement(ag, i);
        float f = fabs(g - g_act);
        float m = max(fabs(g), fabs(g_act));
        if (f > 0.1 && m > 0.f) f /= m;
        if (f > 0.1 || std::isnan(f)) { flag = true; if(verbosity > 0) { curr_flag = true; cerr << "***[" << f << "] "; } }
        if(verbosity + (curr_flag ? 1 : 0) > 1) {
          cerr << g_act << ' ' << g << endl;
          curr_flag = false;
        }
      }
    }
  }

  if (flag) {
    if (verbosity > 1)
      cerr << endl << "*** GRADIENT CHECK FAILED ***" << endl;
  } else {
    if (verbosity > 0)
      cerr << endl << "GRADIENT CHECK PASSED" << endl;
  }
  return !flag;
}